

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QGridLayoutBox>::insert
          (QMovableArrayOps<QGridLayoutBox> *this,qsizetype i,qsizetype n,parameter_type t)

{
  qreal qVar1;
  qreal qVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  long lVar6;
  qsizetype qVar7;
  QGridLayoutBox *pQVar8;
  qsizetype inserts;
  bool bVar9;
  
  qVar2 = t->q_minimumSize;
  qVar3 = t->q_preferredSize;
  qVar4 = t->q_maximumSize;
  qVar5 = t->q_minimumDescent;
  qVar1 = t->q_minimumAscent;
  bVar9 = (this->super_QGenericArrayOps<QGridLayoutBox>).super_QArrayDataPointer<QGridLayoutBox>.
          size != 0;
  QArrayDataPointer<QGridLayoutBox>::detachAndGrow
            ((QArrayDataPointer<QGridLayoutBox> *)this,(uint)(i == 0 && bVar9),n,
             (QGridLayoutBox **)0x0,(QArrayDataPointer<QGridLayoutBox> *)0x0);
  if (i == 0 && bVar9) {
    if (n == 0) {
      return;
    }
    pQVar8 = (this->super_QGenericArrayOps<QGridLayoutBox>).super_QArrayDataPointer<QGridLayoutBox>.
             ptr;
    lVar6 = (this->super_QGenericArrayOps<QGridLayoutBox>).super_QArrayDataPointer<QGridLayoutBox>.
            size;
    qVar7 = n;
    do {
      pQVar8[-1].q_minimumSize = qVar2;
      pQVar8[-1].q_preferredSize = qVar3;
      pQVar8[-1].q_maximumSize = qVar4;
      pQVar8[-1].q_minimumDescent = qVar5;
      pQVar8[-1].q_minimumAscent = qVar1;
      pQVar8 = pQVar8 + -1;
      qVar7 = qVar7 + -1;
    } while (qVar7 != 0);
    (this->super_QGenericArrayOps<QGridLayoutBox>).super_QArrayDataPointer<QGridLayoutBox>.ptr =
         pQVar8;
  }
  else {
    pQVar8 = (this->super_QGenericArrayOps<QGridLayoutBox>).super_QArrayDataPointer<QGridLayoutBox>.
             ptr + i;
    memmove(pQVar8 + n,pQVar8,
            ((this->super_QGenericArrayOps<QGridLayoutBox>).super_QArrayDataPointer<QGridLayoutBox>.
             size - i) * 0x28);
    lVar6 = n;
    if (n != 0) {
      do {
        pQVar8->q_minimumSize = qVar2;
        pQVar8->q_preferredSize = qVar3;
        pQVar8->q_maximumSize = qVar4;
        pQVar8->q_minimumDescent = qVar5;
        pQVar8->q_minimumAscent = qVar1;
        pQVar8 = pQVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    lVar6 = (this->super_QGenericArrayOps<QGridLayoutBox>).super_QArrayDataPointer<QGridLayoutBox>.
            size;
  }
  (this->super_QGenericArrayOps<QGridLayoutBox>).super_QArrayDataPointer<QGridLayoutBox>.size =
       lVar6 + n;
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }